

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
::erase(pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        *__return_storage_ptr__,
       btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       *this,iterator _begin,iterator _end)

{
  undefined1 auVar1 [12];
  bool bVar2;
  byte bVar3;
  bool bVar4;
  slot_type *psVar5;
  slot_type *this_00;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar6;
  uint i;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *this_01;
  size_type sVar7;
  int iVar8;
  size_type to_erase;
  size_type sVar9;
  ulong uVar10;
  size_type i_00;
  unsigned_long uVar11;
  iterator iter;
  iterator iter_00;
  iterator iVar12;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_68;
  size_type local_58;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *local_40;
  long local_38;
  
  this_01 = _begin.node;
  iVar8 = _end.position;
  i = _begin.position;
  uVar11 = 0;
  uVar10 = _begin._8_8_ & 0xffffffff;
  local_50.node = this_01;
  local_50.position = i;
  local_40 = __return_storage_ptr__;
  while ((local_50.node != _end.node || ((int)uVar10 != iVar8))) {
    btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++(&local_50);
    uVar11 = uVar11 + 1;
    uVar10 = (ulong)(uint)local_50.position;
  }
  if (uVar11 == 0) {
    uVar11 = 0;
  }
  else {
    uVar10 = this->size_;
    local_58 = uVar10 - uVar11;
    if (local_58 == 0) {
      clear(this);
      iVar12 = end(this);
      auVar1 = iVar12._0_12_;
    }
    else {
      if (this_01 != _end.node) {
        local_38 = -uVar10;
        while (local_58 < uVar10) {
          bVar2 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  ::leaf(this_01);
          if (bVar2) {
            uVar10 = this->size_ + local_38 + uVar11;
            bVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    ::count(this_01);
            if ((ulong)(long)(int)(bVar3 - i) <= uVar10) {
              uVar10 = (long)(int)(bVar3 - i);
            }
            bVar2 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    ::leaf(this_01);
            if (!bVar2) {
              __assert_fail("node->leaf()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb03,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            bVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    ::count(this_01);
            if ((int)(uint)bVar3 <= (int)i) {
              __assert_fail("node->count() > _begin.position",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb04,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            bVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    ::count(this_01);
            if ((ulong)bVar3 < (long)(int)i + uVar10) {
              __assert_fail("_begin.position + to_erase <= node->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb05,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::remove_values_ignore_children(this_01,i,uVar10,(allocator_type *)this);
            this->size_ = this->size_ - uVar10;
            iter.position = i;
            iter.node = this_01;
            iter._12_4_ = 0;
            iVar12 = rebalance_after_delete(this,iter);
            auVar1 = iVar12._0_12_;
LAB_0018f542:
            this_01 = auVar1._0_8_;
            i = auVar1._8_4_;
          }
          else {
            local_68.node = this_01;
            local_68.position = i;
            bVar2 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    ::leaf(this_01);
            if (!bVar2) {
              btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator--(&local_68);
              bVar4 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                      ::leaf(local_68.node);
              if (!bVar4) {
                __assert_fail("iter.node->leaf()",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xa7e,
                              "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase(iterator) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                             );
              }
              psVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                       ::slot(local_68.node,(long)local_68.position);
              this_00 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        ::slot(this_01,(long)(int)i);
              std::__cxx11::string::operator=((string *)this_00,(string *)psVar5);
              this_01 = local_68.node;
              i = local_68.position;
            }
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::remove_value(this_01,i,(allocator_type *)this);
            this->size_ = this->size_ - 1;
            iVar12.position = local_68.position;
            iVar12.node = local_68.node;
            iVar12._12_4_ = 0;
            iVar12 = rebalance_after_delete(this,iVar12);
            auVar1 = iVar12._0_12_;
            local_50.node = iVar12.node;
            local_50.position = iVar12.position;
            if (bVar2) goto LAB_0018f542;
            btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            ::operator++(&local_50);
            this_01 = local_50.node;
            i = local_50.position;
          }
          uVar10 = this->size_;
        }
        goto LAB_0018f5a8;
      }
      if (iVar8 - i == 0 || iVar8 < (int)i) {
        __assert_fail("_end.position > _begin.position",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0xae6,
                      "void phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                     );
      }
      to_erase = (size_type)(int)(iVar8 - i);
      bVar2 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::leaf(this_01);
      if (!bVar2) {
        i_00 = (size_type)(int)i;
        sVar9 = to_erase;
        sVar7 = i_00;
        local_58 = to_erase;
        while( true ) {
          to_erase = local_58;
          sVar7 = sVar7 + 1;
          bVar2 = sVar9 == 0;
          sVar9 = sVar9 - 1;
          if (bVar2) break;
          pbVar6 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   ::child(this_01,sVar7);
          internal_clear(this,pbVar6);
        }
        while( true ) {
          i_00 = i_00 + 1;
          sVar7 = to_erase + i_00;
          bVar3 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  ::count(this_01);
          if (bVar3 < sVar7) break;
          pbVar6 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   ::child(this_01,sVar7);
          btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::set_child(this_01,i_00,pbVar6);
          btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          ::mutable_child(this_01,sVar7);
        }
      }
      btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
      ::remove_values_ignore_children(this_01,i,to_erase,(allocator_type *)this);
      this->size_ = this->size_ - uVar11;
      iter_00._12_4_ = 0;
      iter_00.node = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                      *)SUB128(_begin._0_12_,0);
      iter_00.position = SUB124(_begin._0_12_,8);
      iVar12 = rebalance_after_delete(this,iter_00);
      auVar1 = iVar12._0_12_;
    }
    this_01 = auVar1._0_8_;
    i = auVar1._8_4_;
  }
LAB_0018f5a8:
  local_40->first = uVar11;
  (local_40->second).node = this_01;
  (local_40->second).position = i;
  return local_40;
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }